

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O3

CURLcode Curl_ssl_peer_key_make(Curl_cfilter *cf,ssl_peer *peer,char *tls_id,char **ppeer_key)

{
  byte bVar1;
  CURLcode CVar2;
  ssl_primary_config *psVar3;
  connectdata *pcVar4;
  uint uVar5;
  char *pcVar6;
  _Bool is_local;
  dynbuf buf;
  size_t key_len;
  _Bool local_59;
  dynbuf local_58;
  size_t local_38;
  
  psVar3 = Curl_ssl_cf_get_primary_config(cf);
  local_59 = false;
  *ppeer_key = (char *)0x0;
  Curl_dyn_init(&local_58,0x2800);
  CVar2 = Curl_dyn_addf(&local_58,"%s:%d",peer->hostname,(ulong)(uint)peer->port);
  if (CVar2 != CURLE_OK) goto LAB_00172957;
  switch(peer->transport) {
  case 3:
    goto switchD_0017298c_caseD_3;
  case 4:
    pcVar6 = ":UDP";
    break;
  case 5:
    pcVar6 = ":QUIC";
    break;
  case 6:
    pcVar6 = ":UNIX";
    break;
  default:
    CVar2 = Curl_dyn_addf(&local_58,":TRNSPRT-%d");
    goto LAB_001729c6;
  }
  CVar2 = Curl_dyn_add(&local_58,pcVar6);
LAB_001729c6:
  if (CVar2 == CURLE_OK) {
switchD_0017298c_caseD_3:
    bVar1 = psVar3->field_0x79;
    if ((bVar1 & 1) == 0) {
      CVar2 = Curl_dyn_add(&local_58,":NO-VRFY-PEER");
      if (CVar2 != CURLE_OK) goto LAB_00172957;
      bVar1 = psVar3->field_0x79;
    }
    if ((bVar1 & 2) == 0) {
      CVar2 = Curl_dyn_add(&local_58,":NO-VRFY-HOST");
      if (CVar2 != CURLE_OK) goto LAB_00172957;
      bVar1 = psVar3->field_0x79;
    }
    if ((bVar1 & 4) != 0) {
      CVar2 = Curl_dyn_add(&local_58,":VRFY-STATUS");
      if (CVar2 != CURLE_OK) goto LAB_00172957;
      bVar1 = psVar3->field_0x79;
    }
    if ((~bVar1 & 3) != 0) {
      pcVar4 = cf->conn;
      uVar5 = SUB84(pcVar4->bits,0);
      if ((uVar5 >> 8 & 1) != 0) {
        CVar2 = Curl_dyn_addf(&local_58,":CHOST-%s",(pcVar4->conn_to_host).name);
        if (CVar2 != CURLE_OK) goto LAB_00172957;
        pcVar4 = cf->conn;
        uVar5 = SUB84(pcVar4->bits,0);
      }
      if (((uVar5 >> 9 & 1) != 0) &&
         (CVar2 = Curl_dyn_addf(&local_58,":CPORT-%d",(ulong)(uint)pcVar4->conn_to_port),
         CVar2 != CURLE_OK)) goto LAB_00172957;
    }
    if (((((((psVar3->version == 0 && psVar3->version_max == 0) ||
            (CVar2 = Curl_dyn_addf(&local_58,":TLSVER-%d-%d",(ulong)psVar3->version,
                                   (ulong)(psVar3->version_max >> 0x10)), CVar2 == CURLE_OK)) &&
           ((psVar3->ssl_options == '\0' ||
            (CVar2 = Curl_dyn_addf(&local_58,":TLSOPT-%x"), CVar2 == CURLE_OK)))) &&
          ((psVar3->cipher_list == (char *)0x0 ||
           (CVar2 = Curl_dyn_addf(&local_58,":CIPHER-%s"), CVar2 == CURLE_OK)))) &&
         (((psVar3->cipher_list13 == (char *)0x0 ||
           (CVar2 = Curl_dyn_addf(&local_58,":CIPHER13-%s"), CVar2 == CURLE_OK)) &&
          ((psVar3->curves == (char *)0x0 ||
           (CVar2 = Curl_dyn_addf(&local_58,":CURVES-%s"), CVar2 == CURLE_OK)))))) &&
        (((psVar3->field_0x79 & 1) == 0 ||
         ((((((CVar2 = cf_ssl_peer_key_add_path(&local_58,"CA",psVar3->CAfile,&local_59),
              CVar2 == CURLE_OK &&
              (CVar2 = cf_ssl_peer_key_add_path(&local_58,"CApath",psVar3->CApath,&local_59),
              CVar2 == CURLE_OK)) &&
             (CVar2 = cf_ssl_peer_key_add_path(&local_58,"CRL",psVar3->CRLfile,&local_59),
             CVar2 == CURLE_OK)) &&
            ((CVar2 = cf_ssl_peer_key_add_path(&local_58,"Issuer",psVar3->issuercert,&local_59),
             CVar2 == CURLE_OK &&
             ((psVar3->cert_blob == (curl_blob *)0x0 ||
              (CVar2 = cf_ssl_peer_key_add_hash(&local_58,"CertBlob",psVar3->cert_blob),
              CVar2 == CURLE_OK)))))) &&
           ((psVar3->ca_info_blob == (curl_blob *)0x0 ||
            (CVar2 = cf_ssl_peer_key_add_hash(&local_58,"CAInfoBlob",psVar3->ca_info_blob),
            CVar2 == CURLE_OK)))) &&
          ((psVar3->issuercert_blob == (curl_blob *)0x0 ||
           (CVar2 = cf_ssl_peer_key_add_hash(&local_58,"IssuerBlob",psVar3->issuercert_blob),
           CVar2 == CURLE_OK)))))))) &&
       ((((psVar3->pinned_key == (char *)0x0 ||
          ((*psVar3->pinned_key == '\0' ||
           (CVar2 = Curl_dyn_addf(&local_58,":Pinned-%s"), CVar2 == CURLE_OK)))) &&
         ((psVar3->clientcert == (char *)0x0 ||
          ((*psVar3->clientcert == '\0' ||
           (CVar2 = Curl_dyn_add(&local_58,":CCERT"), CVar2 == CURLE_OK)))))) &&
        ((((psVar3->username == (char *)0x0 && (psVar3->password == (char *)0x0)) ||
          (CVar2 = Curl_dyn_add(&local_58,":SRP-AUTH"), CVar2 == CURLE_OK)) &&
         (((CVar2 = CURLE_FAILED_INIT, tls_id != (char *)0x0 && (*tls_id != '\0')) &&
          (CVar2 = Curl_dyn_addf(&local_58,":IMPL-%s",tls_id), CVar2 == CURLE_OK)))))))) {
      pcVar6 = ":G";
      if (local_59 != false) {
        pcVar6 = ":L";
      }
      CVar2 = Curl_dyn_addf(&local_58,pcVar6);
      if (CVar2 == CURLE_OK) {
        pcVar6 = Curl_dyn_take(&local_58,&local_38);
        *ppeer_key = pcVar6;
        CVar2 = CURLE_OK;
      }
    }
  }
LAB_00172957:
  Curl_dyn_free(&local_58);
  return CVar2;
}

Assistant:

CURLcode Curl_ssl_peer_key_make(struct Curl_cfilter *cf,
                                const struct ssl_peer *peer,
                                const char *tls_id,
                                char **ppeer_key)
{
  struct ssl_primary_config *ssl = Curl_ssl_cf_get_primary_config(cf);
  struct dynbuf buf;
  size_t key_len;
  bool is_local = FALSE;
  CURLcode r;

  *ppeer_key = NULL;
  Curl_dyn_init(&buf, 10 * 1024);

  r = Curl_dyn_addf(&buf, "%s:%d", peer->hostname, peer->port);
  if(r)
    goto out;

  switch(peer->transport) {
  case TRNSPRT_TCP:
    break;
  case TRNSPRT_UDP:
    r = Curl_dyn_add(&buf, ":UDP");
    break;
  case TRNSPRT_QUIC:
    r = Curl_dyn_add(&buf, ":QUIC");
    break;
  case TRNSPRT_UNIX:
    r = Curl_dyn_add(&buf, ":UNIX");
    break;
  default:
    r = Curl_dyn_addf(&buf, ":TRNSPRT-%d", peer->transport);
    break;
  }
  if(r)
    goto out;

  if(!ssl->verifypeer) {
    r = Curl_dyn_add(&buf, ":NO-VRFY-PEER");
    if(r)
      goto out;
  }
  if(!ssl->verifyhost) {
    r = Curl_dyn_add(&buf, ":NO-VRFY-HOST");
    if(r)
      goto out;
  }
  if(ssl->verifystatus) {
    r = Curl_dyn_add(&buf, ":VRFY-STATUS");
    if(r)
      goto out;
  }
  if(!ssl->verifypeer || !ssl->verifyhost) {
    if(cf->conn->bits.conn_to_host) {
      r = Curl_dyn_addf(&buf, ":CHOST-%s", cf->conn->conn_to_host.name);
      if(r)
        goto out;
    }
    if(cf->conn->bits.conn_to_port) {
      r = Curl_dyn_addf(&buf, ":CPORT-%d", cf->conn->conn_to_port);
      if(r)
        goto out;
    }
  }

  if(ssl->version || ssl->version_max) {
    r = Curl_dyn_addf(&buf, ":TLSVER-%d-%d", ssl->version,
                      (ssl->version_max >> 16));
    if(r)
      goto out;
  }
  if(ssl->ssl_options) {
    r = Curl_dyn_addf(&buf, ":TLSOPT-%x", ssl->ssl_options);
    if(r)
      goto out;
  }
  if(ssl->cipher_list) {
    r = Curl_dyn_addf(&buf, ":CIPHER-%s", ssl->cipher_list);
    if(r)
      goto out;
  }
  if(ssl->cipher_list13) {
    r = Curl_dyn_addf(&buf, ":CIPHER13-%s", ssl->cipher_list13);
    if(r)
      goto out;
  }
  if(ssl->curves) {
    r = Curl_dyn_addf(&buf, ":CURVES-%s", ssl->curves);
    if(r)
      goto out;
  }
  if(ssl->verifypeer) {
    r = cf_ssl_peer_key_add_path(&buf, "CA", ssl->CAfile, &is_local);
    if(r)
      goto out;
    r = cf_ssl_peer_key_add_path(&buf, "CApath", ssl->CApath, &is_local);
    if(r)
      goto out;
    r = cf_ssl_peer_key_add_path(&buf, "CRL", ssl->CRLfile, &is_local);
    if(r)
      goto out;
    r = cf_ssl_peer_key_add_path(&buf, "Issuer", ssl->issuercert, &is_local);
    if(r)
      goto out;
    if(ssl->cert_blob) {
      r = cf_ssl_peer_key_add_hash(&buf, "CertBlob", ssl->cert_blob);
      if(r)
        goto out;
    }
    if(ssl->ca_info_blob) {
      r = cf_ssl_peer_key_add_hash(&buf, "CAInfoBlob", ssl->ca_info_blob);
      if(r)
        goto out;
    }
    if(ssl->issuercert_blob) {
      r = cf_ssl_peer_key_add_hash(&buf, "IssuerBlob", ssl->issuercert_blob);
      if(r)
        goto out;
    }
  }
  if(ssl->pinned_key && ssl->pinned_key[0]) {
    r = Curl_dyn_addf(&buf, ":Pinned-%s", ssl->pinned_key);
    if(r)
      goto out;
  }

  if(ssl->clientcert && ssl->clientcert[0]) {
    r = Curl_dyn_add(&buf, ":CCERT");
    if(r)
      goto out;
  }
#ifdef USE_TLS_SRP
  if(ssl->username || ssl->password) {
    r = Curl_dyn_add(&buf, ":SRP-AUTH");
    if(r)
      goto out;
  }
#endif

  if(!tls_id || !tls_id[0]) {
    r = CURLE_FAILED_INIT;
    goto out;
  }
  r = Curl_dyn_addf(&buf, ":IMPL-%s", tls_id);
  if(r)
    goto out;

  r = Curl_dyn_addf(&buf, is_local ?
                    CURL_SSLS_LOCAL_SUFFIX : CURL_SSLS_GLOBAL_SUFFIX);
  if(r)
    goto out;

  *ppeer_key = Curl_dyn_take(&buf, &key_len);
  /* we just added printable char, and dynbuf always 0 terminates,
   * no need to track length */


out:
  Curl_dyn_free(&buf);
  return r;
}